

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QWidget * __thiscall
QWidgetPrivate::childAt_helper(QWidgetPrivate *this,QPointF *p,bool ignoreChildrenInDestructor)

{
  bool bVar1;
  QPointF *unaff_retaddr;
  undefined7 in_stack_00000008;
  undefined8 in_stack_fffffffffffffff8;
  undefined1 ignoreChildrenInDestructor_00;
  QWidget *pQVar2;
  
  ignoreChildrenInDestructor_00 = (undefined1)((ulong)in_stack_fffffffffffffff8 >> 0x38);
  bVar1 = QList<QObject_*>::isEmpty((QList<QObject_*> *)0x37dccc);
  if (bVar1) {
    pQVar2 = (QWidget *)0x0;
  }
  else {
    bVar1 = pointInsideRectAndMask
                      ((QWidgetPrivate *)p,
                       (QPointF *)CONCAT17(ignoreChildrenInDestructor,in_stack_00000008));
    if (bVar1) {
      pQVar2 = childAtRecursiveHelper
                         ((QWidgetPrivate *)CONCAT17(ignoreChildrenInDestructor,in_stack_00000008),
                          unaff_retaddr,(bool)ignoreChildrenInDestructor_00);
    }
    else {
      pQVar2 = (QWidget *)0x0;
    }
  }
  return pQVar2;
}

Assistant:

QWidget *QWidgetPrivate::childAt_helper(const QPointF &p, bool ignoreChildrenInDestructor) const
{
    if (children.isEmpty())
        return nullptr;

    if (!pointInsideRectAndMask(p))
        return nullptr;
    return childAtRecursiveHelper(p, ignoreChildrenInDestructor);
}